

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigs.c
# Opt level: O0

void get_extensions(int sock,int command,int res)

{
  int in_EDX;
  undefined4 in_ESI;
  int in_EDI;
  
  switch(in_ESI) {
  case 0x2b:
  case 0x2d:
  case 0x38:
  case 0x41:
  case 0x43:
  case 0x46:
  case 0x49:
  case 0x4b:
  case 0x50:
  case 0x58:
  case 0x5b:
  case 0x5c:
  case 0x6a:
  case 0x6d:
  case 0x71:
  case 0x72:
    if (0 < in_EDX) {
      recv(in_EDI,response_buf,(long)in_EDX,0x100);
      response_buf[in_EDX] = '\0';
    }
  }
  return;
}

Assistant:

void get_extensions(int sock, int command, int res)
{
   switch (command)
   {
      case PI_CMD_BI2CZ:
      case PI_CMD_BSCX:
      case PI_CMD_BSPIX:
      case PI_CMD_CF2:
      case PI_CMD_FL:
      case PI_CMD_FR:
      case PI_CMD_I2CPK:
      case PI_CMD_I2CRD:
      case PI_CMD_I2CRI:
      case PI_CMD_I2CRK:
      case PI_CMD_I2CZ:
      case PI_CMD_PROCP:
      case PI_CMD_SERR:
      case PI_CMD_SLR:
      case PI_CMD_SPIX:
      case PI_CMD_SPIR:

         if (res > 0)
         {
            recv(sock, response_buf, res, MSG_WAITALL);
            response_buf[res] = 0;
         }
         break;
   }
}